

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O3

void __thiscall miniros::RPCManager::serverThreadFunc(RPCManager *this)

{
  XmlRpcDispatch *pXVar1;
  set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
  *this_00;
  byte bVar2;
  char cVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  const_iterator in_RSI;
  set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
  *__range3;
  pair<std::_Rb_tree_iterator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::_Rb_tree_iterator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
  pVar6;
  scoped_lock<std::mutex> lock_2;
  scoped_lock<std::mutex> lock;
  scoped_lock<std::mutex> lock_1;
  DurationBase<miniros::WallDuration> local_38;
  
  disableAllSignalsInThisThread();
  setThreadName("RPCManager");
  if (((this->shutting_down_)._M_base._M_i & 1U) == 0) {
    pXVar1 = &(this->server_)._disp;
    this_00 = &this->connections_;
    do {
      iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->added_connections_mutex_);
      if (iVar4 != 0) {
LAB_001f6a6f:
        std::__throw_system_error(iVar4);
      }
      for (p_Var5 = (this->added_connections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 !=
          &(this->added_connections_)._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        (**(code **)(**(long **)(p_Var5 + 1) + 0x10))(*(long **)(p_Var5 + 1),pXVar1);
        in_RSI._M_node = p_Var5 + 1;
        std::
        _Rb_tree<std::shared_ptr<miniros::ASyncXMLRPCConnection>,std::shared_ptr<miniros::ASyncXMLRPCConnection>,std::_Identity<std::shared_ptr<miniros::ASyncXMLRPCConnection>>,std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>>,std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>>>
        ::_M_insert_unique<std::shared_ptr<miniros::ASyncXMLRPCConnection>const&>
                  ((_Rb_tree<std::shared_ptr<miniros::ASyncXMLRPCConnection>,std::shared_ptr<miniros::ASyncXMLRPCConnection>,std::_Identity<std::shared_ptr<miniros::ASyncXMLRPCConnection>>,std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>>,std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>>>
                    *)this_00,(shared_ptr<miniros::ASyncXMLRPCConnection> *)in_RSI._M_node);
      }
      std::
      _Rb_tree<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::_Identity<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
      ::clear(&(this->added_connections_)._M_t);
      pthread_mutex_unlock((pthread_mutex_t *)&this->added_connections_mutex_);
      iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->functions_mutex_);
      if (iVar4 != 0) goto LAB_001f6a6f;
      XmlRpc::XmlRpcServer::work(&this->server_,0.1);
      pthread_mutex_unlock((pthread_mutex_t *)&this->functions_mutex_);
      bVar2 = (this->unbind_requested_)._M_base._M_i;
      while ((bVar2 & 1) != 0) {
        local_38.sec = 0;
        local_38.nsec = 0;
        DurationBase<miniros::WallDuration>::fromSec(&local_38,0.01);
        WallDuration::sleep((WallDuration *)&local_38,(uint)in_RSI._M_node);
        bVar2 = (this->unbind_requested_)._M_base._M_i;
      }
      if (((this->shutting_down_)._M_base._M_i & 1U) != 0) {
        return;
      }
      for (p_Var5 = (this->connections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != &(this->connections_)._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        cVar3 = (**(code **)(**(long **)(p_Var5 + 1) + 0x20))();
        if (cVar3 != '\0') {
          in_RSI._M_node = p_Var5 + 1;
          removeASyncConnection(this,(ASyncXMLRPCConnectionPtr *)in_RSI._M_node);
        }
      }
      iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->removed_connections_mutex_);
      if (iVar4 != 0) goto LAB_001f6a6f;
      for (p_Var5 = (this->removed_connections_)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left;
          (_Rb_tree_header *)p_Var5 !=
          &(this->removed_connections_)._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        (**(code **)(**(long **)(p_Var5 + 1) + 0x18))(*(long **)(p_Var5 + 1),pXVar1);
        pVar6 = std::
                _Rb_tree<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::_Identity<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
                ::equal_range(&this_00->_M_t,(key_type *)(p_Var5 + 1));
        in_RSI._M_node = (_Base_ptr)pVar6.first._M_node;
        std::
        _Rb_tree<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::_Identity<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
        ::_M_erase_aux(&this_00->_M_t,in_RSI,(_Base_ptr)pVar6.second._M_node);
      }
      std::
      _Rb_tree<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::_Identity<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
      ::clear(&(this->removed_connections_)._M_t);
      pthread_mutex_unlock((pthread_mutex_t *)&this->removed_connections_mutex_);
    } while (((this->shutting_down_)._M_base._M_i & 1U) == 0);
  }
  return;
}

Assistant:

void RPCManager::serverThreadFunc()
{
  disableAllSignalsInThisThread();
  setThreadName("RPCManager");

  while(!shutting_down_)
  {
    {
      std::scoped_lock<std::mutex> lock(added_connections_mutex_);
      auto it = added_connections_.begin();
      auto end = added_connections_.end();
      for (; it != end; ++it)
      {
        (*it)->addToDispatch(server_.get_dispatch());
        connections_.insert(*it);
      }

      added_connections_.clear();
    }

    // Update the XMLRPC server, blocking for at most 100ms in select()
    {
      std::scoped_lock<std::mutex> lock(functions_mutex_);
      server_.work(0.1);
    }

    while (unbind_requested_)
    {
      WallDuration(0.01).sleep();
    }

    if (shutting_down_)
    {
      return;
    }

    {
      for (auto& connection: connections_)
      {
        if (connection->check())
          removeASyncConnection(connection);
      }
    }

    {
      std::scoped_lock<std::mutex> lock(removed_connections_mutex_);
      auto it = removed_connections_.begin();
      auto end = removed_connections_.end();
      for (; it != end; ++it)
      {
        (*it)->removeFromDispatch(server_.get_dispatch());
        connections_.erase(*it);
      }

      removed_connections_.clear();
    }
  }
}